

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostcheckPass.cpp
# Opt level: O2

PreservedAnalyses * __thiscall
Postcheck::run(PreservedAnalyses *__return_storage_ptr__,Postcheck *this,Module *M,
              ModuleAnalysisManager *AM)

{
  char cVar1;
  Module *pMVar2;
  Function *pFVar3;
  CallGraph *this_00;
  CallGraphNode *node;
  Module *F;
  Function *pFVar4;
  Function *pFVar5;
  Module *pMVar6;
  Function *pFVar7;
  char *pcVar8;
  bool bVar9;
  StringRef SVar10;
  StringRef RHS;
  Child local_b8 [2];
  StringRef local_90;
  Twine local_80;
  Twine local_58;
  
  F = (Module *)0x0;
  for (pMVar2 = M + 0x20; pMVar2 = *(Module **)pMVar2, pMVar2 != M + 0x18; pMVar2 = pMVar2 + 8) {
    pMVar6 = pMVar2 + -0x38;
    if (pMVar2 == (Module *)0x0) {
      pMVar6 = (Module *)0x0;
    }
    if ((((byte)pMVar6[0x21] & 0x20) == 0) &&
       (bVar9 = F != (Module *)0x0, F = pMVar2 + -0x38, bVar9)) goto LAB_00129519;
  }
  if (F == (Module *)0x0) {
    pcVar8 = "No functions found in module!";
  }
  else {
    SVar10.Length = (size_t)"shellvm-main";
    SVar10.Data = (char *)F;
    cVar1 = llvm::Function::hasFnAttribute(SVar10);
    if (cVar1 != '\0') {
      pMVar2 = M + 0x10;
LAB_00129422:
      pMVar2 = *(Module **)pMVar2;
      if (pMVar2 != M + 8) goto code_r0x0012942a;
      for (pFVar3 = (Function *)F + 0x50; pFVar3 = *(Function **)pFVar3,
          pFVar3 != (Function *)F + 0x48; pFVar3 = pFVar3 + 8) {
        pFVar4 = pFVar3 + -0x18;
        if (pFVar3 == (Function *)0x0) {
          pFVar4 = (Function *)0x0;
        }
        pFVar5 = pFVar4 + 0x30;
        while (pFVar5 = *(Function **)pFVar5, pFVar5 != pFVar4 + 0x28) {
          pFVar7 = pFVar5 + -0x18;
          if (pFVar5 == (Function *)0x0) {
            pFVar7 = (Function *)0x0;
          }
          pFVar5 = pFVar5 + 8;
          if (pFVar7[0x10] == (Function)0x1e) {
            pcVar8 = "Switch instruction found within main function.";
            goto LAB_00129511;
          }
        }
      }
      this_00 = (CallGraph *)operator_new(0x48);
      llvm::CallGraph::CallGraph(this_00,M);
      node = llvm::CallGraph::operator[](this_00,(Function *)F);
      bVar9 = dfsTraverse(this,node);
      if (bVar9) {
        llvm::PreservedAnalyses::all();
        return __return_storage_ptr__;
      }
      goto LAB_0012958b;
    }
    local_90 = (StringRef)llvm::Value::getName();
    llvm::operator+(&local_58,"SheLLVM main function ",&local_90);
    llvm::Twine::Twine(&local_80," has no shellvm-main attribute!");
    llvm::operator+((Twine *)&local_b8[0].ptrAndLength,&local_58,&local_80);
    llvm::report_fatal_error((Twine *)&local_b8[0].ptrAndLength,true);
LAB_0012958b:
    pcVar8 = "Non-intrinsic external call found within main function!";
  }
LAB_00129511:
  do {
    llvm::report_fatal_error(pcVar8,true);
LAB_00129519:
    pcVar8 = "More than one function in module!";
  } while( true );
code_r0x0012942a:
  pMVar6 = pMVar2 + -0x38;
  if (pMVar2 == (Module *)0x0) {
    pMVar6 = (Module *)0x0;
  }
  local_b8[0].ptrAndLength =
       (anon_struct_16_2_27cbee6f_for_ptrAndLength)
       llvm::GlobalObject::getSection((GlobalObject *)pMVar6);
  RHS.Length = 0xd;
  RHS.Data = "llvm.metadata";
  bVar9 = llvm::StringRef::equals((StringRef *)&local_b8[0].ptrAndLength,RHS);
  pMVar2 = pMVar2 + 8;
  if (!bVar9) goto code_r0x0012945a;
  goto LAB_00129422;
code_r0x0012945a:
  pcVar8 = "Module has global variables!";
  goto LAB_00129511;
}

Assistant:

llvm::PreservedAnalyses Postcheck::run(Module &M, ModuleAnalysisManager &AM) {
  // Check 1: Make sure we only have a single function, with the attribute
  // shellvm-main.
  Function *mainFunc = nullptr;

  for (Function &f : M.functions()) {
    if (f.isIntrinsic()) {
      continue;
    }

    if (mainFunc) {
      report_fatal_error("More than one function in module!");
      mainFunc = nullptr;
      continue;
    }

    mainFunc = &f;
  }

  if (!mainFunc) {
    report_fatal_error("No functions found in module!");
  }

  if (mainFunc && !mainFunc->hasFnAttribute("shellvm-main")) {
    report_fatal_error("SheLLVM main function " + mainFunc->getName() +
                       " has no shellvm-main attribute!");
  }

  // Check 2: Make sure there are no globals.
  for (GlobalVariable &global : M.getGlobalList()) {
    if (!global.getSection().equals("llvm.metadata")) {
      report_fatal_error("Module has global variables!");
    }
  }

  // Check 3: No switch instructions allowed in function body.
  if (mainFunc) {
    for (BasicBlock &BB : *mainFunc) {
      for (Instruction &I : BB) {
        if (isa<SwitchInst>(I)) {
          report_fatal_error("Switch instruction found within main function.");
        }
      }
    }

    // Check 4: No external calls (that aren't LLVM intrinsics).
    CallGraph *cg = new CallGraph(M);
    CallGraphNode *cgn = cg->operator[](mainFunc);
    if (!dfsTraverse(cgn)) {
      report_fatal_error(
          "Non-intrinsic external call found within main function!");
    }
  }

  return llvm::PreservedAnalyses::all();
}